

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRoundedBoxShape.cpp
# Opt level: O3

void __thiscall chrono::ChRoundedBoxShape::ArchiveIN(ChRoundedBoxShape *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::geometry::ChRoundedBox> specFuncA;
  undefined **local_38;
  ChRoundedBox *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 local_18;
  
  ChArchiveIn::VersionRead<chrono::ChRoundedBoxShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_30 = &this->groundedbox;
  local_28 = "groundedbox";
  local_18 = 0;
  local_38 = &PTR__ChFunctorArchiveIn_00b41930;
  local_20 = (undefined1 *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  return;
}

Assistant:

void ChRoundedBoxShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChRoundedBoxShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(groundedbox);
}